

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

RawVecSize
dxil_spv::raw_access_structured_vectorize
          (Impl *impl,Type *type,Value *index,uint stride,Value *byte_offset,uint32_t mask)

{
  bool bVar1;
  uint32_t mask_local;
  Value *byte_offset_local;
  uint stride_local;
  Value *index_local;
  Type *type_local;
  Impl *impl_local;
  
  if ((mask == 0xf) &&
     (bVar1 = raw_access_structured_can_vectorize(impl,type,index,stride,byte_offset,4), bVar1)) {
    impl_local._4_4_ = V4;
  }
  else if ((mask == 7) &&
          (bVar1 = raw_access_structured_can_vectorize(impl,type,index,stride,byte_offset,3), bVar1)
          ) {
    impl_local._4_4_ = V3;
  }
  else if ((mask == 3) &&
          (bVar1 = raw_access_structured_can_vectorize(impl,type,index,stride,byte_offset,2), bVar1)
          ) {
    impl_local._4_4_ = V2;
  }
  else {
    impl_local._4_4_ = V1;
  }
  return impl_local._4_4_;
}

Assistant:

RawVecSize raw_access_structured_vectorize(
	Converter::Impl &impl, const llvm::Type *type,
	const llvm::Value *index,
	unsigned stride,
    const llvm::Value *byte_offset,
	uint32_t mask)
{
	if (mask == 0xfu && raw_access_structured_can_vectorize(impl, type, index, stride, byte_offset, 4))
		return RawVecSize::V4;
	else if (mask == 0x7u && raw_access_structured_can_vectorize(impl, type, index, stride, byte_offset, 3))
		return RawVecSize::V3;
	else if (mask == 0x3u && raw_access_structured_can_vectorize(impl, type, index, stride, byte_offset, 2))
		return RawVecSize::V2;
	else
		return RawVecSize::V1;
}